

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  Curl_llist_element *pCVar1;
  Curl_easy *pCVar2;
  CURLMcode CVar3;
  Curl_easy *data;
  
  CVar3 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (CVar3 = CURLM_BAD_HANDLE, multi->magic == 0xbab1e)) {
    if ((multi->field_0x1b1 & 4) == 0) {
      multi->magic = 0;
      pCVar1 = (multi->msgsent).head;
      if (pCVar1 != (Curl_llist_element *)0x0) {
        *(undefined8 *)((long)pCVar1->ptr + 0xc0) = 0;
      }
      process_pending_handles(multi);
      data = multi->easyp;
      while (data != (Curl_easy *)0x0) {
        pCVar2 = data->next;
        if ((((data->state).field_0x74d & 8) == 0) && (data->conn != (connectdata *)0x0)) {
          multi_done(data,CURLE_OK,true);
        }
        if ((data->dns).hostcachetype == HCACHE_MULTI) {
          Curl_hostcache_clean(data,(data->dns).hostcache);
          (data->dns).hostcache = (Curl_hash *)0x0;
          (data->dns).hostcachetype = HCACHE_NONE;
        }
        (data->state).conn_cache = (conncache *)0x0;
        data->multi = (Curl_multi *)0x0;
        data = pCVar2;
      }
      Curl_conncache_close_all_connections(&multi->conn_cache);
      sockhash_destroy(&multi->sockhash);
      Curl_conncache_destroy(&multi->conn_cache);
      Curl_hash_destroy(&multi->hostcache);
      close(multi->wakeup_pair[0]);
      close(multi->wakeup_pair[1]);
      Curl_free_multi_ssl_backend_data(multi->ssl_backend_data);
      (*Curl_cfree)(multi);
      CVar3 = CURLM_OK;
    }
    else {
      CVar3 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  struct Curl_easy *data;
  struct Curl_easy *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    if(multi->in_callback)
      return CURLM_RECURSIVE_API_CALL;

    multi->magic = 0; /* not good anymore */

    unlink_all_msgsent_handles(multi);
    process_pending_handles(multi);
    /* First remove all remaining easy handles */
    data = multi->easyp;
    while(data) {
      nextdata = data->next;
      if(!data->state.done && data->conn)
        /* if DONE was never called for this handle */
        (void)multi_done(data, CURLE_OK, TRUE);
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

#ifdef USE_LIBPSL
      if(data->psl == &multi->psl)
        data->psl = NULL;
#endif

      data = nextdata;
    }

    /* Close all the connections in the connection cache */
    Curl_conncache_close_all_connections(&multi->conn_cache);

    sockhash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_hash_destroy(&multi->hostcache);
    Curl_psl_destroy(&multi->psl);

#ifdef USE_WINSOCK
    WSACloseEvent(multi->wsa_event);
#else
#ifdef ENABLE_WAKEUP
    wakeup_close(multi->wakeup_pair[0]);
    wakeup_close(multi->wakeup_pair[1]);
#endif
#endif

#ifdef USE_SSL
    Curl_free_multi_ssl_backend_data(multi->ssl_backend_data);
#endif

    free(multi);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}